

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExporter.cpp
# Opt level: O2

void __thiscall iDynTree::ModelExporter::ModelExporter(ModelExporter *this)

{
  _Head_base<0UL,_iDynTree::ModelExporter::Pimpl_*,_false> this_00;
  
  this_00._M_head_impl = (Pimpl *)operator_new(0x198);
  memset(this_00._M_head_impl,0,0x198);
  Pimpl::Pimpl(this_00._M_head_impl);
  (this->m_pimpl)._M_t.
  super___uniq_ptr_impl<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_iDynTree::ModelExporter::Pimpl_*,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
  .super__Head_base<0UL,_iDynTree::ModelExporter::Pimpl_*,_false>._M_head_impl =
       this_00._M_head_impl;
  (this_00._M_head_impl)->m_isModelValid = false;
  return;
}

Assistant:

ModelExporter::ModelExporter()
: m_pimpl(new Pimpl())
{
    m_pimpl->m_isModelValid = false;
}